

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-delayed-accept.c
# Opt level: O1

void do_accept(uv_timer_t *timer_handle)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  undefined8 uVar5;
  undefined8 *extraout_RDX;
  undefined8 *__size;
  long *__ptr;
  int64_t eval_b;
  int64_t eval_a;
  undefined8 uStack_48;
  long lStack_40;
  uv_timer_t *puStack_38;
  code *pcStack_30;
  undefined8 local_28;
  long local_20;
  
  iVar3 = (int)&local_28;
  pcStack_30 = (code *)0x185055;
  pvVar4 = malloc(0xd8);
  if (timer_handle == (uv_timer_t *)0x0) {
    pcStack_30 = (code *)0x185106;
    do_accept_cold_4();
LAB_00185106:
    pcStack_30 = (code *)0x18510b;
    do_accept_cold_3();
LAB_0018510b:
    pcStack_30 = (code *)0x185118;
    do_accept_cold_1();
  }
  else {
    if (pvVar4 == (void *)0x0) goto LAB_00185106;
    pcStack_30 = (code *)0x18506f;
    uVar5 = uv_default_loop();
    pcStack_30 = (code *)0x18507a;
    iVar2 = uv_tcp_init(uVar5,pvVar4);
    local_20 = (long)iVar2;
    local_28 = 0;
    if (local_20 != 0) goto LAB_0018510b;
    pvVar1 = timer_handle->data;
    pcStack_30 = (code *)0x1850a2;
    iVar2 = uv_accept(pvVar1,pvVar4);
    local_20 = (long)iVar2;
    local_28 = 0;
    if (local_20 == 0) {
      do_accept_called = do_accept_called + 1;
      pcStack_30 = (code *)0x1850d1;
      uv_close(pvVar4,close_cb);
      if (do_accept_called == 2) {
        pcStack_30 = (code *)0x1850e9;
        uv_close(pvVar1,close_cb);
      }
      uv_close(timer_handle,close_cb);
      return;
    }
  }
  __ptr = &local_20;
  pcStack_30 = close_cb;
  do_accept_cold_2();
  if (__ptr != (long *)0x0) {
    puStack_38 = (uv_timer_t *)0x185130;
    free(__ptr);
    close_cb_called = close_cb_called + 1;
    return;
  }
  puStack_38 = (uv_timer_t *)connect_cb;
  close_cb_cold_1();
  __size = &uStack_48;
  puStack_38 = timer_handle;
  if (__ptr == (long *)0x0) {
    connect_cb_cold_3();
  }
  else {
    lStack_40 = (long)iVar3;
    uStack_48 = 0;
    if (lStack_40 == 0) {
      iVar3 = uv_read_start(__ptr[10],alloc_cb,read_cb);
      lStack_40 = (long)iVar3;
      uStack_48 = 0;
      if (lStack_40 == 0) {
        connect_cb_called = connect_cb_called + 1;
        free(__ptr);
        return;
      }
      goto LAB_001851bb;
    }
  }
  connect_cb_cold_1();
LAB_001851bb:
  connect_cb_cold_2();
  pvVar4 = malloc((size_t)__size);
  *extraout_RDX = pvVar4;
  extraout_RDX[1] = __size;
  return;
}

Assistant:

static void do_accept(uv_timer_t* timer_handle) {
  uv_tcp_t* server;
  uv_tcp_t* accepted_handle = (uv_tcp_t*)malloc(sizeof *accepted_handle);
  int r;

  ASSERT_NOT_NULL(timer_handle);
  ASSERT_NOT_NULL(accepted_handle);

  r = uv_tcp_init(uv_default_loop(), accepted_handle);
  ASSERT_OK(r);

  server = (uv_tcp_t*)timer_handle->data;
  r = uv_accept((uv_stream_t*)server, (uv_stream_t*)accepted_handle);
  ASSERT_OK(r);

  do_accept_called++;

  /* Immediately close the accepted handle. */
  uv_close((uv_handle_t*)accepted_handle, close_cb);

  /* After accepting the two clients close the server handle */
  if (do_accept_called == 2) {
    uv_close((uv_handle_t*)server, close_cb);
  }

  /* Dispose the timer. */
  uv_close((uv_handle_t*)timer_handle, close_cb);
}